

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O0

void ncnn::convdw3x3s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  long lVar35;
  long lVar36;
  undefined8 *puVar37;
  undefined1 (*pauVar38) [32];
  undefined1 (*pauVar39) [32];
  undefined1 (*pauVar40) [32];
  undefined1 (*pauVar41) [32];
  undefined1 (*pauVar42) [32];
  undefined1 (*pauVar43) [32];
  undefined1 (*pauVar44) [32];
  undefined1 (*pauVar45) [32];
  undefined1 (*pauVar46) [32];
  undefined1 (*pauVar47) [32];
  undefined1 (*pauVar48) [32];
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m256 _r22_5;
  __m256 _r21_5;
  __m256 _r20_5;
  __m256 _k22_5;
  __m256 _k21_5;
  __m256 _k20_5;
  __m256 _r12_5;
  __m256 _r11_5;
  __m256 _r10_5;
  __m256 _k12_5;
  __m256 _k11_5;
  __m256 _k10_5;
  __m256 _r02_5;
  __m256 _r01_5;
  __m256 _r00_5;
  __m256 _k02_5;
  __m256 _k01_5;
  __m256 _k00_5;
  __m256 _sum0_3;
  __m256 _r23_3;
  __m256 _r22_4;
  __m256 _r21_4;
  __m256 _r20_4;
  __m256 _k22_4;
  __m256 _k21_4;
  __m256 _k20_4;
  __m256 _r13_3;
  __m256 _r12_4;
  __m256 _r11_4;
  __m256 _r10_4;
  __m256 _k12_4;
  __m256 _k11_4;
  __m256 _k10_4;
  __m256 _r03_3;
  __m256 _r02_4;
  __m256 _r01_4;
  __m256 _r00_4;
  __m256 _k02_4;
  __m256 _k01_4;
  __m256 _k00_4;
  __m256 _sum1_2;
  __m256 _sum0_2;
  __m256 _r25_1;
  __m256 _r24_1;
  __m256 _r23_2;
  __m256 _r22_3;
  __m256 _r21_3;
  __m256 _r20_3;
  __m256 _k22_3;
  __m256 _k21_3;
  __m256 _k20_3;
  __m256 _r15_1;
  __m256 _r14_1;
  __m256 _r13_2;
  __m256 _r12_3;
  __m256 _r11_3;
  __m256 _r10_3;
  __m256 _k12_3;
  __m256 _k11_3;
  __m256 _k10_3;
  __m256 _r05_1;
  __m256 _r04_1;
  __m256 _r03_2;
  __m256 _r02_3;
  __m256 _r01_3;
  __m256 _r00_3;
  __m256 _k02_3;
  __m256 _k01_3;
  __m256 _k00_3;
  __m256 _sum3;
  __m256 _sum2;
  __m256 _sum1_1;
  __m256 _sum0_1;
  int j_1;
  __m256 _r32_2;
  __m256 _r31_2;
  __m256 _r30_2;
  __m256 _r22_2;
  __m256 _r21_2;
  __m256 _r20_2;
  __m256 _k22_2;
  __m256 _k21_2;
  __m256 _k20_2;
  __m256 _r12_2;
  __m256 _r11_2;
  __m256 _r10_2;
  __m256 _k12_2;
  __m256 _k11_2;
  __m256 _k10_2;
  __m256 _r02_2;
  __m256 _r01_2;
  __m256 _r00_2;
  __m256 _k02_2;
  __m256 _k01_2;
  __m256 _k00_2;
  __m256 _sum1;
  __m256 _sum0;
  __m256 _r33_1;
  __m256 _r32_1;
  __m256 _r31_1;
  __m256 _r30_1;
  __m256 _r23_1;
  __m256 _r22_1;
  __m256 _r21_1;
  __m256 _r20_1;
  __m256 _k22_1;
  __m256 _k21_1;
  __m256 _k20_1;
  __m256 _r13_1;
  __m256 _r12_1;
  __m256 _r11_1;
  __m256 _r10_1;
  __m256 _k12_1;
  __m256 _k11_1;
  __m256 _k10_1;
  __m256 _r03_1;
  __m256 _r02_1;
  __m256 _r01_1;
  __m256 _r00_1;
  __m256 _k02_1;
  __m256 _k01_1;
  __m256 _k00_1;
  __m256 _sum11_1;
  __m256 _sum10_1;
  __m256 _sum01_1;
  __m256 _sum00_1;
  __m256 _r35;
  __m256 _r34;
  __m256 _r33;
  __m256 _r32;
  __m256 _r31;
  __m256 _r30;
  __m256 _r25;
  __m256 _r24;
  __m256 _r23;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _r15;
  __m256 _r14;
  __m256 _r13;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _r05;
  __m256 _r04;
  __m256 _r03;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  __m256 _sum13;
  __m256 _sum12;
  __m256 _sum11;
  __m256 _sum10;
  __m256 _sum03;
  __m256 _sum02;
  __m256 _sum01;
  __m256 _sum00;
  int j;
  int i;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr1;
  float *outptr0;
  float *k0;
  __m256 _bias0;
  Mat out;
  int g;
  float *bias;
  int group;
  int outh;
  int outw;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_dac0;
  undefined8 uStack_dab8;
  undefined8 local_d760;
  undefined8 uStack_d758;
  undefined8 local_d740;
  undefined8 uStack_d738;
  undefined8 local_d280;
  undefined8 uStack_d278;
  undefined8 local_d260;
  undefined8 uStack_d258;
  undefined8 local_d240;
  undefined8 uStack_d238;
  undefined8 local_d220;
  undefined8 uStack_d218;
  undefined8 local_caa0;
  undefined8 uStack_ca98;
  undefined8 local_c9c0;
  undefined8 uStack_c9b8;
  undefined8 local_c5c0;
  undefined8 uStack_c5b8;
  undefined8 local_c5a0;
  undefined8 uStack_c598;
  undefined8 local_c440;
  undefined8 uStack_c438;
  undefined8 local_c420;
  undefined8 uStack_c418;
  undefined8 local_be20;
  undefined8 uStack_be18;
  undefined8 local_be00;
  undefined8 uStack_bdf8;
  undefined8 local_bde0;
  undefined8 uStack_bdd8;
  undefined8 local_bdc0;
  undefined8 uStack_bdb8;
  undefined8 local_bbe0;
  undefined8 uStack_bbd8;
  undefined8 local_bbc0;
  undefined8 uStack_bbb8;
  undefined8 local_bba0;
  undefined8 uStack_bb98;
  undefined8 local_bb80;
  undefined8 uStack_bb78;
  undefined8 local_b080;
  undefined8 uStack_b078;
  undefined8 uStack_b070;
  undefined8 uStack_b068;
  int local_a6e4;
  int local_9b38;
  int local_9b34;
  undefined1 (*local_9b30) [32];
  undefined1 (*local_9b28) [32];
  undefined1 (*local_9b20) [32];
  undefined1 (*local_9b18) [32];
  undefined8 *local_9ac8;
  undefined8 *local_9ac0;
  int local_9a34;
  
  iVar1 = *(int *)((long)in_RDI + 0x2c);
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar35 = in_RSI[6];
  lVar36 = in_RDI[7];
  lVar4 = *in_RCX;
  for (local_9a34 = 0; local_9a34 < (int)lVar36; local_9a34 = local_9a34 + 1) {
    local_9ac0 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_9a34 * in_RSI[2]);
    if (lVar4 == 0) {
      local_b080 = 0;
      uStack_b078 = 0;
      uStack_b070 = 0;
      uStack_b068 = 0;
    }
    else {
      puVar37 = (undefined8 *)(lVar4 + (long)(local_9a34 << 3) * 4);
      local_b080 = *puVar37;
      uStack_b078 = puVar37[1];
      uStack_b070 = puVar37[2];
      uStack_b068 = puVar37[3];
    }
    pauVar38 = (undefined1 (*) [32])
               (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_9a34 * in_RDX[2]);
    local_9ac8 = (undefined8 *)((long)local_9ac0 + (long)*(int *)((long)in_RSI + 0x2c) * in_RSI[2]);
    iVar3 = *(int *)((long)in_RDI + 0x2c);
    local_9b18 = (undefined1 (*) [32])(*in_RDI + in_RDI[8] * (long)local_9a34 * in_RDI[2]);
    lVar5 = in_RDI[2];
    local_9b20 = (undefined1 (*) [32])(*local_9b18 + iVar3 * lVar5);
    local_9b28 = (undefined1 (*) [32])(*local_9b18 + (long)iVar3 * 2 * lVar5);
    local_9b30 = (undefined1 (*) [32])(*local_9b18 + (long)iVar3 * 3 * lVar5);
    for (local_9b34 = 0; local_9b34 + 1 < (int)lVar35; local_9b34 = local_9b34 + 2) {
      for (local_9b38 = 0; local_9b38 + 3 < iVar2; local_9b38 = local_9b38 + 4) {
        pauVar39 = pauVar38 + 1;
        pauVar40 = pauVar38 + 2;
        pauVar41 = local_9b18 + 2;
        pauVar42 = local_9b18 + 3;
        auVar14._8_8_ = uStack_b078;
        auVar14._0_8_ = local_b080;
        auVar14._16_8_ = uStack_b070;
        auVar14._24_8_ = uStack_b068;
        auVar6 = vfmadd213ps_fma(*local_9b18,*pauVar38,auVar14);
        auVar15._8_8_ = uStack_b078;
        auVar15._0_8_ = local_b080;
        auVar15._16_8_ = uStack_b070;
        auVar15._24_8_ = uStack_b068;
        auVar7 = vfmadd213ps_fma(local_9b18[1],*pauVar38,auVar15);
        auVar16._8_8_ = uStack_b078;
        auVar16._0_8_ = local_b080;
        auVar16._16_8_ = uStack_b070;
        auVar16._24_8_ = uStack_b068;
        auVar8 = vfmadd213ps_fma(*pauVar41,*pauVar38,auVar16);
        auVar17._8_8_ = uStack_b078;
        auVar17._0_8_ = local_b080;
        auVar17._16_8_ = uStack_b070;
        auVar17._24_8_ = uStack_b068;
        auVar9 = vfmadd213ps_fma(*pauVar42,*pauVar38,auVar17);
        auVar6 = vfmadd213ps_fma(local_9b18[1],*pauVar39,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar41,*pauVar39,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar42,*pauVar39,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(local_9b18[4],*pauVar39,ZEXT1632(auVar9));
        auVar6 = vfmadd213ps_fma(*pauVar41,*pauVar40,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar42,*pauVar40,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(local_9b18[4],*pauVar40,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(local_9b18[5],*pauVar40,ZEXT1632(auVar9));
        pauVar41 = pauVar38 + 3;
        pauVar42 = pauVar38 + 4;
        pauVar43 = pauVar38 + 5;
        pauVar44 = local_9b20 + 1;
        pauVar45 = local_9b20 + 2;
        pauVar46 = local_9b20 + 3;
        pauVar47 = local_9b20 + 4;
        auVar18._8_8_ = uStack_b078;
        auVar18._0_8_ = local_b080;
        auVar18._16_8_ = uStack_b070;
        auVar18._24_8_ = uStack_b068;
        auVar10 = vfmadd213ps_fma(*local_9b20,*pauVar38,auVar18);
        auVar19._8_8_ = uStack_b078;
        auVar19._0_8_ = local_b080;
        auVar19._16_8_ = uStack_b070;
        auVar19._24_8_ = uStack_b068;
        auVar11 = vfmadd213ps_fma(*pauVar44,*pauVar38,auVar19);
        auVar20._8_8_ = uStack_b078;
        auVar20._0_8_ = local_b080;
        auVar20._16_8_ = uStack_b070;
        auVar20._24_8_ = uStack_b068;
        auVar12 = vfmadd213ps_fma(*pauVar45,*pauVar38,auVar20);
        auVar21._8_8_ = uStack_b078;
        auVar21._0_8_ = local_b080;
        auVar21._16_8_ = uStack_b070;
        auVar21._24_8_ = uStack_b068;
        auVar13 = vfmadd213ps_fma(*pauVar46,*pauVar38,auVar21);
        auVar6 = vfmadd213ps_fma(*local_9b20,*pauVar41,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar44,*pauVar41,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar45,*pauVar41,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(*pauVar46,*pauVar41,ZEXT1632(auVar9));
        auVar10 = vfmadd213ps_fma(*pauVar44,*pauVar39,ZEXT1632(auVar10));
        auVar11 = vfmadd213ps_fma(*pauVar45,*pauVar39,ZEXT1632(auVar11));
        auVar12 = vfmadd213ps_fma(*pauVar46,*pauVar39,ZEXT1632(auVar12));
        auVar13 = vfmadd213ps_fma(*pauVar47,*pauVar39,ZEXT1632(auVar13));
        auVar6 = vfmadd213ps_fma(*pauVar44,*pauVar42,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar45,*pauVar42,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar46,*pauVar42,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(*pauVar47,*pauVar42,ZEXT1632(auVar9));
        auVar10 = vfmadd213ps_fma(*pauVar45,*pauVar40,ZEXT1632(auVar10));
        auVar11 = vfmadd213ps_fma(*pauVar46,*pauVar40,ZEXT1632(auVar11));
        auVar12 = vfmadd213ps_fma(*pauVar47,*pauVar40,ZEXT1632(auVar12));
        auVar13 = vfmadd213ps_fma(local_9b20[5],*pauVar40,ZEXT1632(auVar13));
        auVar6 = vfmadd213ps_fma(*pauVar45,*pauVar43,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar46,*pauVar43,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar47,*pauVar43,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(local_9b20[5],*pauVar43,ZEXT1632(auVar9));
        pauVar39 = pauVar38 + 6;
        pauVar40 = pauVar38 + 7;
        pauVar44 = pauVar38 + 8;
        pauVar45 = local_9b28 + 1;
        pauVar46 = local_9b28 + 2;
        pauVar47 = local_9b28 + 3;
        pauVar48 = local_9b28 + 4;
        auVar10 = vfmadd213ps_fma(*local_9b28,*pauVar41,ZEXT1632(auVar10));
        auVar11 = vfmadd213ps_fma(*pauVar45,*pauVar41,ZEXT1632(auVar11));
        auVar12 = vfmadd213ps_fma(*pauVar46,*pauVar41,ZEXT1632(auVar12));
        auVar13 = vfmadd213ps_fma(*pauVar47,*pauVar41,ZEXT1632(auVar13));
        auVar6 = vfmadd213ps_fma(*local_9b28,*pauVar39,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar45,*pauVar39,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar46,*pauVar39,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(*pauVar47,*pauVar39,ZEXT1632(auVar9));
        auVar10 = vfmadd213ps_fma(*pauVar45,*pauVar42,ZEXT1632(auVar10));
        auVar11 = vfmadd213ps_fma(*pauVar46,*pauVar42,ZEXT1632(auVar11));
        auVar12 = vfmadd213ps_fma(*pauVar47,*pauVar42,ZEXT1632(auVar12));
        auVar13 = vfmadd213ps_fma(*pauVar48,*pauVar42,ZEXT1632(auVar13));
        auVar6 = vfmadd213ps_fma(*pauVar45,*pauVar40,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar46,*pauVar40,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar47,*pauVar40,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(*pauVar48,*pauVar40,ZEXT1632(auVar9));
        auVar10 = vfmadd213ps_fma(*pauVar46,*pauVar43,ZEXT1632(auVar10));
        auVar11 = vfmadd213ps_fma(*pauVar47,*pauVar43,ZEXT1632(auVar11));
        auVar12 = vfmadd213ps_fma(*pauVar48,*pauVar43,ZEXT1632(auVar12));
        auVar13 = vfmadd213ps_fma(local_9b28[5],*pauVar43,ZEXT1632(auVar13));
        auVar6 = vfmadd213ps_fma(*pauVar46,*pauVar44,ZEXT1632(auVar6));
        local_bb80 = auVar6._0_8_;
        uStack_bb78 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(*pauVar47,*pauVar44,ZEXT1632(auVar7));
        local_bba0 = auVar6._0_8_;
        uStack_bb98 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(*pauVar48,*pauVar44,ZEXT1632(auVar8));
        local_bbc0 = auVar6._0_8_;
        uStack_bbb8 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(local_9b28[5],*pauVar44,ZEXT1632(auVar9));
        local_bbe0 = auVar6._0_8_;
        uStack_bbd8 = auVar6._8_8_;
        pauVar41 = local_9b30 + 2;
        pauVar42 = local_9b30 + 3;
        auVar6 = vfmadd213ps_fma(*local_9b30,*pauVar39,ZEXT1632(auVar10));
        auVar7 = vfmadd213ps_fma(local_9b30[1],*pauVar39,ZEXT1632(auVar11));
        auVar8 = vfmadd213ps_fma(*pauVar41,*pauVar39,ZEXT1632(auVar12));
        auVar9 = vfmadd213ps_fma(*pauVar42,*pauVar39,ZEXT1632(auVar13));
        auVar6 = vfmadd213ps_fma(local_9b30[1],*pauVar40,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar41,*pauVar40,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar42,*pauVar40,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(local_9b30[4],*pauVar40,ZEXT1632(auVar9));
        auVar6 = vfmadd213ps_fma(*pauVar41,*pauVar44,ZEXT1632(auVar6));
        local_bdc0 = auVar6._0_8_;
        uStack_bdb8 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(*pauVar42,*pauVar44,ZEXT1632(auVar7));
        local_bde0 = auVar6._0_8_;
        uStack_bdd8 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(local_9b30[4],*pauVar44,ZEXT1632(auVar8));
        local_be00 = auVar6._0_8_;
        uStack_bdf8 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(local_9b30[5],*pauVar44,ZEXT1632(auVar9));
        local_be20 = auVar6._0_8_;
        uStack_be18 = auVar6._8_8_;
        *local_9ac0 = local_bb80;
        local_9ac0[1] = uStack_bb78;
        local_9ac0[2] = 0;
        local_9ac0[3] = 0;
        local_9ac0[4] = local_bba0;
        local_9ac0[5] = uStack_bb98;
        local_9ac0[6] = 0;
        local_9ac0[7] = 0;
        local_9ac0[8] = local_bbc0;
        local_9ac0[9] = uStack_bbb8;
        local_9ac0[10] = 0;
        local_9ac0[0xb] = 0;
        local_9ac0[0xc] = local_bbe0;
        local_9ac0[0xd] = uStack_bbd8;
        local_9ac0[0xe] = 0;
        local_9ac0[0xf] = 0;
        *local_9ac8 = local_bdc0;
        local_9ac8[1] = uStack_bdb8;
        local_9ac8[2] = 0;
        local_9ac8[3] = 0;
        local_9ac8[4] = local_bde0;
        local_9ac8[5] = uStack_bdd8;
        local_9ac8[6] = 0;
        local_9ac8[7] = 0;
        local_9ac8[8] = local_be00;
        local_9ac8[9] = uStack_bdf8;
        local_9ac8[10] = 0;
        local_9ac8[0xb] = 0;
        local_9ac8[0xc] = local_be20;
        local_9ac8[0xd] = uStack_be18;
        local_9ac8[0xe] = 0;
        local_9ac8[0xf] = 0;
        local_9b18 = local_9b18 + 4;
        local_9b20 = local_9b20 + 4;
        local_9b28 = local_9b28 + 4;
        local_9b30 = local_9b30 + 4;
        local_9ac0 = local_9ac0 + 0x10;
        local_9ac8 = local_9ac8 + 0x10;
      }
      for (; local_9b38 + 1 < iVar2; local_9b38 = local_9b38 + 2) {
        pauVar39 = pauVar38 + 1;
        pauVar40 = pauVar38 + 2;
        auVar22._8_8_ = uStack_b078;
        auVar22._0_8_ = local_b080;
        auVar22._16_8_ = uStack_b070;
        auVar22._24_8_ = uStack_b068;
        auVar6 = vfmadd213ps_fma(*local_9b18,*pauVar38,auVar22);
        auVar23._8_8_ = uStack_b078;
        auVar23._0_8_ = local_b080;
        auVar23._16_8_ = uStack_b070;
        auVar23._24_8_ = uStack_b068;
        auVar7 = vfmadd213ps_fma(local_9b18[1],*pauVar38,auVar23);
        auVar6 = vfmadd213ps_fma(local_9b18[1],*pauVar39,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b18[2],*pauVar39,ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(local_9b18[2],*pauVar40,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b18[3],*pauVar40,ZEXT1632(auVar7));
        pauVar41 = pauVar38 + 3;
        pauVar42 = pauVar38 + 4;
        pauVar43 = pauVar38 + 5;
        pauVar44 = local_9b20 + 1;
        pauVar45 = local_9b20 + 2;
        auVar6 = vfmadd213ps_fma(*local_9b20,*pauVar41,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar44,*pauVar41,ZEXT1632(auVar7));
        auVar24._8_8_ = uStack_b078;
        auVar24._0_8_ = local_b080;
        auVar24._16_8_ = uStack_b070;
        auVar24._24_8_ = uStack_b068;
        auVar8 = vfmadd213ps_fma(*local_9b20,*pauVar38,auVar24);
        auVar25._8_8_ = uStack_b078;
        auVar25._0_8_ = local_b080;
        auVar25._16_8_ = uStack_b070;
        auVar25._24_8_ = uStack_b068;
        auVar9 = vfmadd213ps_fma(*pauVar44,*pauVar38,auVar25);
        auVar6 = vfmadd213ps_fma(*pauVar44,*pauVar42,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar45,*pauVar42,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar44,*pauVar39,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(*pauVar45,*pauVar39,ZEXT1632(auVar9));
        auVar6 = vfmadd213ps_fma(*pauVar45,*pauVar43,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b20[3],*pauVar43,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar45,*pauVar40,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(local_9b20[3],*pauVar40,ZEXT1632(auVar9));
        pauVar39 = pauVar38 + 6;
        pauVar40 = pauVar38 + 7;
        pauVar44 = pauVar38 + 8;
        pauVar45 = local_9b28 + 1;
        pauVar46 = local_9b28 + 2;
        auVar6 = vfmadd213ps_fma(*local_9b28,*pauVar39,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar45,*pauVar39,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*local_9b28,*pauVar41,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(*pauVar45,*pauVar41,ZEXT1632(auVar9));
        auVar6 = vfmadd213ps_fma(*pauVar45,*pauVar40,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar46,*pauVar40,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar45,*pauVar42,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(*pauVar46,*pauVar42,ZEXT1632(auVar9));
        auVar6 = vfmadd213ps_fma(*pauVar46,*pauVar44,ZEXT1632(auVar6));
        local_c420 = auVar6._0_8_;
        uStack_c418 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(local_9b28[3],*pauVar44,ZEXT1632(auVar7));
        local_c440 = auVar6._0_8_;
        uStack_c438 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(*pauVar46,*pauVar43,ZEXT1632(auVar8));
        auVar7 = vfmadd213ps_fma(local_9b28[3],*pauVar43,ZEXT1632(auVar9));
        auVar6 = vfmadd213ps_fma(*local_9b30,*pauVar39,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b30[1],*pauVar39,ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(local_9b30[1],*pauVar40,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b30[2],*pauVar40,ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(local_9b30[2],*pauVar44,ZEXT1632(auVar6));
        local_c5a0 = auVar6._0_8_;
        uStack_c598 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(local_9b30[3],*pauVar44,ZEXT1632(auVar7));
        local_c5c0 = auVar6._0_8_;
        uStack_c5b8 = auVar6._8_8_;
        *local_9ac0 = local_c420;
        local_9ac0[1] = uStack_c418;
        local_9ac0[2] = 0;
        local_9ac0[3] = 0;
        local_9ac0[4] = local_c440;
        local_9ac0[5] = uStack_c438;
        local_9ac0[6] = 0;
        local_9ac0[7] = 0;
        *local_9ac8 = local_c5a0;
        local_9ac8[1] = uStack_c598;
        local_9ac8[2] = 0;
        local_9ac8[3] = 0;
        local_9ac8[4] = local_c5c0;
        local_9ac8[5] = uStack_c5b8;
        local_9ac8[6] = 0;
        local_9ac8[7] = 0;
        local_9b18 = local_9b18 + 2;
        local_9b20 = local_9b20 + 2;
        local_9b28 = local_9b28 + 2;
        local_9b30 = local_9b30 + 2;
        local_9ac0 = local_9ac0 + 8;
        local_9ac8 = local_9ac8 + 8;
      }
      for (; local_9b38 < iVar2; local_9b38 = local_9b38 + 1) {
        auVar26._8_8_ = uStack_b078;
        auVar26._0_8_ = local_b080;
        auVar26._16_8_ = uStack_b070;
        auVar26._24_8_ = uStack_b068;
        auVar6 = vfmadd213ps_fma(*local_9b18,*pauVar38,auVar26);
        auVar6 = vfmadd213ps_fma(local_9b18[1],pauVar38[1],ZEXT1632(auVar6));
        auVar6 = vfmadd213ps_fma(local_9b18[2],pauVar38[2],ZEXT1632(auVar6));
        auVar6 = vfmadd213ps_fma(*local_9b20,pauVar38[3],ZEXT1632(auVar6));
        auVar27._8_8_ = uStack_b078;
        auVar27._0_8_ = local_b080;
        auVar27._16_8_ = uStack_b070;
        auVar27._24_8_ = uStack_b068;
        auVar7 = vfmadd213ps_fma(*local_9b20,*pauVar38,auVar27);
        auVar6 = vfmadd213ps_fma(local_9b20[1],pauVar38[4],ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b20[1],pauVar38[1],ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(local_9b20[2],pauVar38[5],ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b20[2],pauVar38[2],ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(*local_9b28,pauVar38[6],ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*local_9b28,pauVar38[3],ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(local_9b28[1],pauVar38[7],ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b28[1],pauVar38[4],ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(local_9b28[2],pauVar38[8],ZEXT1632(auVar6));
        local_c9c0 = auVar6._0_8_;
        uStack_c9b8 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(local_9b28[2],pauVar38[5],ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(*local_9b30,pauVar38[6],ZEXT1632(auVar6));
        auVar6 = vfmadd213ps_fma(local_9b30[1],pauVar38[7],ZEXT1632(auVar6));
        auVar6 = vfmadd213ps_fma(local_9b30[2],pauVar38[8],ZEXT1632(auVar6));
        local_caa0 = auVar6._0_8_;
        uStack_ca98 = auVar6._8_8_;
        *local_9ac0 = local_c9c0;
        local_9ac0[1] = uStack_c9b8;
        local_9ac0[2] = 0;
        local_9ac0[3] = 0;
        *local_9ac8 = local_caa0;
        local_9ac8[1] = uStack_ca98;
        local_9ac8[2] = 0;
        local_9ac8[3] = 0;
        local_9b18 = local_9b18 + 1;
        local_9b20 = local_9b20 + 1;
        local_9b28 = local_9b28 + 1;
        local_9b30 = local_9b30 + 1;
        local_9ac0 = local_9ac0 + 4;
        local_9ac8 = local_9ac8 + 4;
      }
      local_9b18 = (undefined1 (*) [32])(*local_9b18 + (long)(iVar1 * 8 + 0x10) * 4);
      local_9b20 = (undefined1 (*) [32])(*local_9b20 + (long)(iVar1 * 8 + 0x10) * 4);
      local_9b28 = (undefined1 (*) [32])(*local_9b28 + (long)(iVar1 * 8 + 0x10) * 4);
      local_9b30 = (undefined1 (*) [32])(*local_9b30 + (long)(iVar1 * 8 + 0x10) * 4);
      local_9ac0 = (undefined8 *)((long)local_9ac0 + (long)(iVar2 << 3) * 4);
      local_9ac8 = (undefined8 *)((long)local_9ac8 + (long)(iVar2 << 3) * 4);
    }
    for (; local_9b34 < (int)lVar35; local_9b34 = local_9b34 + 1) {
      for (local_a6e4 = 0; local_a6e4 + 3 < iVar2; local_a6e4 = local_a6e4 + 4) {
        pauVar39 = pauVar38 + 1;
        pauVar40 = pauVar38 + 2;
        pauVar41 = local_9b18 + 2;
        pauVar42 = local_9b18 + 3;
        auVar28._8_8_ = uStack_b078;
        auVar28._0_8_ = local_b080;
        auVar28._16_8_ = uStack_b070;
        auVar28._24_8_ = uStack_b068;
        auVar6 = vfmadd213ps_fma(*local_9b18,*pauVar38,auVar28);
        auVar29._8_8_ = uStack_b078;
        auVar29._0_8_ = local_b080;
        auVar29._16_8_ = uStack_b070;
        auVar29._24_8_ = uStack_b068;
        auVar7 = vfmadd213ps_fma(local_9b18[1],*pauVar38,auVar29);
        auVar30._8_8_ = uStack_b078;
        auVar30._0_8_ = local_b080;
        auVar30._16_8_ = uStack_b070;
        auVar30._24_8_ = uStack_b068;
        auVar8 = vfmadd213ps_fma(*pauVar41,*pauVar38,auVar30);
        auVar31._8_8_ = uStack_b078;
        auVar31._0_8_ = local_b080;
        auVar31._16_8_ = uStack_b070;
        auVar31._24_8_ = uStack_b068;
        auVar9 = vfmadd213ps_fma(*pauVar42,*pauVar38,auVar31);
        auVar6 = vfmadd213ps_fma(local_9b18[1],*pauVar39,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar41,*pauVar39,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar42,*pauVar39,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(local_9b18[4],*pauVar39,ZEXT1632(auVar9));
        auVar6 = vfmadd213ps_fma(*pauVar41,*pauVar40,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar42,*pauVar40,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(local_9b18[4],*pauVar40,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(local_9b18[5],*pauVar40,ZEXT1632(auVar9));
        pauVar39 = pauVar38 + 3;
        pauVar40 = pauVar38 + 4;
        pauVar41 = pauVar38 + 5;
        pauVar42 = local_9b20 + 2;
        pauVar43 = local_9b20 + 3;
        auVar6 = vfmadd213ps_fma(*local_9b20,*pauVar39,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b20[1],*pauVar39,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar42,*pauVar39,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(*pauVar43,*pauVar39,ZEXT1632(auVar9));
        auVar6 = vfmadd213ps_fma(local_9b20[1],*pauVar40,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar42,*pauVar40,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar43,*pauVar40,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(local_9b20[4],*pauVar40,ZEXT1632(auVar9));
        auVar6 = vfmadd213ps_fma(*pauVar42,*pauVar41,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar43,*pauVar41,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(local_9b20[4],*pauVar41,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(local_9b20[5],*pauVar41,ZEXT1632(auVar9));
        pauVar39 = pauVar38 + 6;
        pauVar40 = pauVar38 + 7;
        pauVar41 = pauVar38 + 8;
        pauVar42 = local_9b28 + 2;
        pauVar43 = local_9b28 + 3;
        auVar6 = vfmadd213ps_fma(*local_9b28,*pauVar39,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b28[1],*pauVar39,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar42,*pauVar39,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(*pauVar43,*pauVar39,ZEXT1632(auVar9));
        auVar6 = vfmadd213ps_fma(local_9b28[1],*pauVar40,ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(*pauVar42,*pauVar40,ZEXT1632(auVar7));
        auVar8 = vfmadd213ps_fma(*pauVar43,*pauVar40,ZEXT1632(auVar8));
        auVar9 = vfmadd213ps_fma(local_9b28[4],*pauVar40,ZEXT1632(auVar9));
        auVar6 = vfmadd213ps_fma(*pauVar42,*pauVar41,ZEXT1632(auVar6));
        local_d220 = auVar6._0_8_;
        uStack_d218 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(*pauVar43,*pauVar41,ZEXT1632(auVar7));
        local_d240 = auVar6._0_8_;
        uStack_d238 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(local_9b28[4],*pauVar41,ZEXT1632(auVar8));
        local_d260 = auVar6._0_8_;
        uStack_d258 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(local_9b28[5],*pauVar41,ZEXT1632(auVar9));
        local_d280 = auVar6._0_8_;
        uStack_d278 = auVar6._8_8_;
        *local_9ac0 = local_d220;
        local_9ac0[1] = uStack_d218;
        local_9ac0[2] = 0;
        local_9ac0[3] = 0;
        local_9ac0[4] = local_d240;
        local_9ac0[5] = uStack_d238;
        local_9ac0[6] = 0;
        local_9ac0[7] = 0;
        local_9ac0[8] = local_d260;
        local_9ac0[9] = uStack_d258;
        local_9ac0[10] = 0;
        local_9ac0[0xb] = 0;
        local_9ac0[0xc] = local_d280;
        local_9ac0[0xd] = uStack_d278;
        local_9ac0[0xe] = 0;
        local_9ac0[0xf] = 0;
        local_9b18 = local_9b18 + 4;
        local_9b20 = local_9b20 + 4;
        local_9b28 = local_9b28 + 4;
        local_9ac0 = local_9ac0 + 0x10;
      }
      for (; local_a6e4 + 1 < iVar2; local_a6e4 = local_a6e4 + 2) {
        auVar32._8_8_ = uStack_b078;
        auVar32._0_8_ = local_b080;
        auVar32._16_8_ = uStack_b070;
        auVar32._24_8_ = uStack_b068;
        auVar6 = vfmadd213ps_fma(*local_9b18,*pauVar38,auVar32);
        auVar33._8_8_ = uStack_b078;
        auVar33._0_8_ = local_b080;
        auVar33._16_8_ = uStack_b070;
        auVar33._24_8_ = uStack_b068;
        auVar7 = vfmadd213ps_fma(local_9b18[1],*pauVar38,auVar33);
        auVar6 = vfmadd213ps_fma(local_9b18[1],pauVar38[1],ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b18[2],pauVar38[1],ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(local_9b18[2],pauVar38[2],ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b18[3],pauVar38[2],ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(*local_9b20,pauVar38[3],ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b20[1],pauVar38[3],ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(local_9b20[1],pauVar38[4],ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b20[2],pauVar38[4],ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(local_9b20[2],pauVar38[5],ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b20[3],pauVar38[5],ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(*local_9b28,pauVar38[6],ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b28[1],pauVar38[6],ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(local_9b28[1],pauVar38[7],ZEXT1632(auVar6));
        auVar7 = vfmadd213ps_fma(local_9b28[2],pauVar38[7],ZEXT1632(auVar7));
        auVar6 = vfmadd213ps_fma(local_9b28[2],pauVar38[8],ZEXT1632(auVar6));
        local_d740 = auVar6._0_8_;
        uStack_d738 = auVar6._8_8_;
        auVar6 = vfmadd213ps_fma(local_9b28[3],pauVar38[8],ZEXT1632(auVar7));
        local_d760 = auVar6._0_8_;
        uStack_d758 = auVar6._8_8_;
        *local_9ac0 = local_d740;
        local_9ac0[1] = uStack_d738;
        local_9ac0[2] = 0;
        local_9ac0[3] = 0;
        local_9ac0[4] = local_d760;
        local_9ac0[5] = uStack_d758;
        local_9ac0[6] = 0;
        local_9ac0[7] = 0;
        local_9b18 = local_9b18 + 2;
        local_9b20 = local_9b20 + 2;
        local_9b28 = local_9b28 + 2;
        local_9ac0 = local_9ac0 + 8;
      }
      for (; local_a6e4 < iVar2; local_a6e4 = local_a6e4 + 1) {
        auVar34._8_8_ = uStack_b078;
        auVar34._0_8_ = local_b080;
        auVar34._16_8_ = uStack_b070;
        auVar34._24_8_ = uStack_b068;
        auVar6 = vfmadd213ps_fma(*local_9b18,*pauVar38,auVar34);
        auVar6 = vfmadd213ps_fma(local_9b18[1],pauVar38[1],ZEXT1632(auVar6));
        auVar6 = vfmadd213ps_fma(local_9b18[2],pauVar38[2],ZEXT1632(auVar6));
        auVar6 = vfmadd213ps_fma(*local_9b20,pauVar38[3],ZEXT1632(auVar6));
        auVar6 = vfmadd213ps_fma(local_9b20[1],pauVar38[4],ZEXT1632(auVar6));
        auVar6 = vfmadd213ps_fma(local_9b20[2],pauVar38[5],ZEXT1632(auVar6));
        auVar6 = vfmadd213ps_fma(*local_9b28,pauVar38[6],ZEXT1632(auVar6));
        auVar6 = vfmadd213ps_fma(local_9b28[1],pauVar38[7],ZEXT1632(auVar6));
        auVar6 = vfmadd213ps_fma(local_9b28[2],pauVar38[8],ZEXT1632(auVar6));
        local_dac0 = auVar6._0_8_;
        uStack_dab8 = auVar6._8_8_;
        *local_9ac0 = local_dac0;
        local_9ac0[1] = uStack_dab8;
        local_9ac0[2] = 0;
        local_9ac0[3] = 0;
        local_9b18 = local_9b18 + 1;
        local_9b20 = local_9b20 + 1;
        local_9b28 = local_9b28 + 1;
        local_9ac0 = local_9ac0 + 4;
      }
      local_9b18 = local_9b18 + 2;
      local_9b20 = local_9b20 + 2;
      local_9b28 = local_9b28 + 2;
    }
  }
  return;
}

Assistant:

static void convdw3x3s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);
        float* outptr1 = out.row(1);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);

        int i = 0;
        for (; i + 1 < outh; i += 2)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum00 = _bias0;
                __m256 _sum01 = _bias0;
                __m256 _sum02 = _bias0;
                __m256 _sum03 = _bias0;
                __m256 _sum10 = _bias0;
                __m256 _sum11 = _bias0;
                __m256 _sum12 = _bias0;
                __m256 _sum13 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);
                __m256 _r05 = _mm256_load_ps(r0 + 40);

                _sum00 = _mm256_comp_fmadd_ps(_k00, _r00, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k00, _r01, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k00, _r02, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k00, _r03, _sum03);
                _sum00 = _mm256_comp_fmadd_ps(_k01, _r01, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k01, _r02, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k01, _r03, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k01, _r04, _sum03);
                _sum00 = _mm256_comp_fmadd_ps(_k02, _r02, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k02, _r03, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k02, _r04, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k02, _r05, _sum03);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);
                __m256 _r15 = _mm256_load_ps(r1 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k00, _r10, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k00, _r11, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k00, _r12, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k00, _r13, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k10, _r10, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k10, _r11, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k10, _r12, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k10, _r13, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k01, _r11, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k01, _r12, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k01, _r13, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k01, _r14, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k11, _r11, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k11, _r12, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k11, _r13, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k11, _r14, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k02, _r12, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k02, _r13, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k02, _r14, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k02, _r15, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k12, _r12, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k12, _r13, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k12, _r14, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k12, _r15, _sum03);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);
                __m256 _r25 = _mm256_load_ps(r2 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k10, _r20, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k10, _r21, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k10, _r22, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k10, _r23, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k20, _r20, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k20, _r21, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k20, _r22, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k20, _r23, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k11, _r21, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k11, _r22, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k11, _r23, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k11, _r24, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k21, _r21, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k21, _r22, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k21, _r23, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k21, _r24, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k12, _r22, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k12, _r23, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k12, _r24, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k12, _r25, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k22, _r22, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k22, _r23, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k22, _r24, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k22, _r25, _sum03);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);
                __m256 _r34 = _mm256_load_ps(r3 + 32);
                __m256 _r35 = _mm256_load_ps(r3 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k20, _r30, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k20, _r31, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k20, _r32, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k20, _r33, _sum13);
                _sum10 = _mm256_comp_fmadd_ps(_k21, _r31, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k21, _r32, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k21, _r33, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k21, _r34, _sum13);
                _sum10 = _mm256_comp_fmadd_ps(_k22, _r32, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k22, _r33, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k22, _r34, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k22, _r35, _sum13);

                _mm256_store_ps(outptr0, _sum00);
                _mm256_store_ps(outptr0 + 8, _sum01);
                _mm256_store_ps(outptr0 + 16, _sum02);
                _mm256_store_ps(outptr0 + 24, _sum03);
                _mm256_store_ps(outptr1, _sum10);
                _mm256_store_ps(outptr1 + 8, _sum11);
                _mm256_store_ps(outptr1 + 16, _sum12);
                _mm256_store_ps(outptr1 + 24, _sum13);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                r3 += 32;
                outptr0 += 32;
                outptr1 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum00 = _bias0;
                __m256 _sum01 = _bias0;
                __m256 _sum10 = _bias0;
                __m256 _sum11 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k00, _r00, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k00, _r01, _sum01);
                _sum00 = _mm256_comp_fmadd_ps(_k01, _r01, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k01, _r02, _sum01);
                _sum00 = _mm256_comp_fmadd_ps(_k02, _r02, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k02, _r03, _sum01);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k10, _r10, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k10, _r11, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k00, _r10, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k00, _r11, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k11, _r11, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k11, _r12, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k01, _r11, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k01, _r12, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k12, _r12, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k12, _r13, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k02, _r12, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k02, _r13, _sum11);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k20, _r20, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k20, _r21, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k10, _r20, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k10, _r21, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k21, _r21, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k21, _r22, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k11, _r21, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k11, _r22, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k22, _r22, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k22, _r23, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k12, _r22, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k12, _r23, _sum11);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);

                _sum10 = _mm256_comp_fmadd_ps(_k20, _r30, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k20, _r31, _sum11);
                _sum10 = _mm256_comp_fmadd_ps(_k21, _r31, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k21, _r32, _sum11);
                _sum10 = _mm256_comp_fmadd_ps(_k22, _r32, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k22, _r33, _sum11);

                _mm256_store_ps(outptr0, _sum00);
                _mm256_store_ps(outptr0 + 8, _sum01);
                _mm256_store_ps(outptr1, _sum10);
                _mm256_store_ps(outptr1 + 8, _sum11);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                r3 += 16;
                outptr0 += 16;
                outptr1 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r10, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r11, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r12, _sum1);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r20, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r21, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r22, _sum1);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);

                _sum1 = _mm256_comp_fmadd_ps(_k20, _r30, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r31, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r32, _sum1);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr1, _sum1);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                r3 += 8;
                outptr0 += 8;
                outptr1 += 8;
            }

            r0 += 2 * 8 + w * 8;
            r1 += 2 * 8 + w * 8;
            r2 += 2 * 8 + w * 8;
            r3 += 2 * 8 + w * 8;

            outptr0 += outw * 8;
            outptr1 += outw * 8;
        }
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;
                __m256 _sum2 = _bias0;
                __m256 _sum3 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);
                __m256 _r05 = _mm256_load_ps(r0 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);
                __m256 _r15 = _mm256_load_ps(r1 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);
                __m256 _r25 = _mm256_load_ps(r2 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);
                _mm256_store_ps(outptr0 + 16, _sum2);
                _mm256_store_ps(outptr0 + 24, _sum3);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_store_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }

            r0 += 2 * 8;
            r1 += 2 * 8;
            r2 += 2 * 8;
        }
    }
}